

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

void __thiscall
mjs::global_object::validate_type
          (global_object *this,value *v,object_ptr *expected_prototype,char *expected_type)

{
  char *pcVar1;
  gc_heap_ptr_untyped *pgVar2;
  void *pvVar3;
  void *pvVar4;
  wostream *pwVar5;
  native_error_exception *this_00;
  undefined1 local_208 [16];
  object_ptr p;
  object_ptr oval;
  wstring_view local_1b8;
  wostringstream woss;
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  if (v->type_ == object) {
    pgVar2 = &value::object_value(v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&oval.super_gc_heap_ptr_untyped,pgVar2);
    if (oval.super_gc_heap_ptr_untyped.heap_ == (gc_heap *)0x0) {
      __assert_fail("oval",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0x323,
                    "void mjs::global_object::validate_type(const value &, const object_ptr &, const char *) const"
                   );
    }
    gc_heap_ptr_untyped::get(&oval.super_gc_heap_ptr_untyped);
    mjs::object::prototype((object *)&p);
    if (p.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
      pvVar3 = gc_heap_ptr_untyped::get(&p.super_gc_heap_ptr_untyped);
      pvVar4 = gc_heap_ptr_untyped::get(&expected_prototype->super_gc_heap_ptr_untyped);
      if (pvVar3 == pvVar4) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&p.super_gc_heap_ptr_untyped);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&oval.super_gc_heap_ptr_untyped);
        std::__cxx11::wostringstream::~wostringstream((wostringstream *)&woss);
        return;
      }
    }
    pgVar2 = &value::object_value(v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::get(pgVar2);
    mjs::object::class_name((object *)local_208);
    mjs::operator<<((wostream *)&woss,(string *)local_208);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&p.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&oval.super_gc_heap_ptr_untyped);
  }
  else {
    debug_print((wostream *)&woss,v,2,1,0);
  }
  pwVar5 = std::operator<<((wostream *)&woss," is not a");
  pvVar3 = memchr("aeiou",(int)*expected_type,6);
  pcVar1 = "\\n";
  if (pvVar3 == (void *)0x0) {
    pcVar1 = "\t";
  }
  pwVar5 = std::operator<<(pwVar5,pcVar1 + 1);
  pwVar5 = std::operator<<(pwVar5," ");
  std::operator<<(pwVar5,expected_type);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_((wstring *)&oval,this);
  local_208._0_8_ = oval.super_gc_heap_ptr_untyped._8_8_;
  local_208._8_8_ = oval.super_gc_heap_ptr_untyped.heap_;
  std::__cxx11::wstringbuf::str();
  local_1b8._M_len = p.super_gc_heap_ptr_untyped._8_8_;
  local_1b8._M_str = (wchar_t *)p.super_gc_heap_ptr_untyped.heap_;
  native_error_exception::native_error_exception(this_00,type,(wstring_view *)local_208,&local_1b8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void global_object::validate_type(const value& v, const object_ptr& expected_prototype, const char* expected_type) const {
    std::wostringstream woss;
    if (v.type() == value_type::object) {
        auto oval = v.object_value();
        assert(oval);
        auto p = oval->prototype();
        if (p && p.get() == expected_prototype.get()) {
            return;
        }
        woss << v.object_value()->class_name();
    } else {
        mjs::debug_print(woss, v, 2, 1);
    }
    woss << " is not a" << (strchr("aeiou", expected_type[0]) ? "n" : "") << " " << expected_type;
    throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
}